

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O3

void xmlInitMutex(xmlMutexPtr mutex)

{
  pthread_mutex_init((pthread_mutex_t *)mutex,(pthread_mutexattr_t *)0x0);
  return;
}

Assistant:

void
xmlInitMutex(xmlMutexPtr mutex)
{
#ifdef HAVE_POSIX_THREADS
    pthread_mutex_init(&mutex->lock, NULL);
#elif defined HAVE_WIN32_THREADS
    InitializeCriticalSection(&mutex->cs);
#else
    (void) mutex;
#endif
}